

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void ProcessThread::removePid(pid_t f_pid)

{
  bool bVar1;
  pointer ppVar2;
  shared_ptr<EventLoop> local_48;
  _Self local_38 [3];
  _Self local_20;
  iterator it;
  lock_guard<std::mutex> lock;
  pid_t f_pid_local;
  
  lock._M_device._4_4_ = f_pid;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&sProcessMutex);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
       ::find(&sProcesses,(key_type_conflict *)((long)&lock._M_device + 4));
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
       ::end(&sProcesses);
  bVar1 = std::operator!=(&local_20,local_38);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ProcessThread::ProcessData>_>::operator->
                       (&local_20);
    (ppVar2->second).proc = (Process *)0x0;
    std::shared_ptr<EventLoop>::shared_ptr(&local_48);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ProcessThread::ProcessData>_>::operator->
                       (&local_20);
    std::weak_ptr<EventLoop>::operator=(&(ppVar2->second).loop,&local_48);
    std::shared_ptr<EventLoop>::~shared_ptr(&local_48);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return;
}

Assistant:

void ProcessThread::removePid(pid_t f_pid)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);

    auto it = sProcesses.find(f_pid);
    if (it != sProcesses.end()) {
        it->second.proc = nullptr;
        it->second.loop = EventLoop::SharedPtr();
    }
}